

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_test_driver.cc
# Opt level: O0

void __thiscall
libaom_test::DecoderTest::RunLoop
          (DecoderTest *this,CompressedVideoSource *video,aom_codec_dec_cfg_t *dec_cfg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  undefined4 uVar3;
  long lVar4;
  ulong uVar5;
  undefined8 *in_RDX;
  long *in_RSI;
  AssertionResult *in_RDI;
  aom_image_t *img;
  DxDataIterator dec_iter;
  AssertionResult gtest_ar_1;
  aom_codec_err_t res_dec_1;
  aom_codec_err_t res_dec;
  AssertionResult gtest_ar_;
  aom_codec_err_t res_peek;
  aom_codec_stream_info_t stream_info;
  bool peeked_stream;
  bool end_of_file;
  AssertionResult gtest_ar;
  Decoder *decoder;
  aom_codec_stream_info_t *in_stack_fffffffffffffe38;
  Decoder *in_stack_fffffffffffffe40;
  aom_image_t *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  char *in_stack_fffffffffffffe58;
  Message *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  AssertionResult *in_stack_fffffffffffffe70;
  AssertionResult *this_00;
  undefined6 in_stack_fffffffffffffea8;
  undefined1 uVar6;
  byte bVar7;
  char *in_stack_fffffffffffffeb0;
  AssertionResult *this_01;
  aom_image_t *local_130;
  AssertionResult local_f8;
  aom_codec_err_t local_e8;
  aom_codec_err_t local_e4;
  string local_e0 [55];
  undefined1 local_a9;
  AssertionResult local_a8;
  aom_codec_err_t local_94;
  undefined4 local_7c;
  byte local_76;
  byte local_75;
  uint local_74;
  undefined8 local_50;
  AssertionResult local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long *local_20;
  long *local_10;
  
  pbVar1 = (in_RDI->message_)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  local_38 = *(undefined4 *)in_RDX;
  uStack_34 = *(undefined4 *)((long)in_RDX + 4);
  uStack_30 = *(undefined4 *)(in_RDX + 1);
  uStack_2c = *(undefined4 *)((long)in_RDX + 0xc);
  local_10 = in_RSI;
  local_20 = (long *)(**(code **)(*(long *)pbVar1 + 0x18))
                               (pbVar1,*in_RDX,in_RDX[1],
                                (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )*(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                    *)(in_RDI + 2));
  local_50 = 0;
  this_01 = &local_48;
  testing::internal::CmpHelperNE<libaom_test::Decoder*,decltype(nullptr)>
            (in_stack_fffffffffffffe58,
             (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             (Decoder **)in_stack_fffffffffffffe48,&in_stack_fffffffffffffe40->_vptr_Decoder);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe70);
    in_stack_fffffffffffffeb0 =
         testing::AssertionResult::failure_message((AssertionResult *)0x3d8527);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffe70,
               (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),(char *)in_stack_fffffffffffffe60,
               (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)in_RDI);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
    testing::Message::~Message((Message *)0x3d8584);
  }
  local_74 = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d85f2);
  if (local_74 == 0) {
    local_75 = 0;
    local_76 = 0;
    (**(code **)(*local_10 + 0x18))();
    while( true ) {
      bVar2 = testing::Test::HasFailure();
      bVar7 = 0;
      if (!bVar2) {
        bVar7 = local_75 ^ 0xff;
      }
      if ((bVar7 & 1) == 0) break;
      (**(code **)((long)*(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                           *)in_RDI + 0x20))(in_RDI,local_10,local_20);
      local_7c = 0;
      lVar4 = (**(code **)(*local_10 + 0x28))();
      if (lVar4 == 0) {
        local_e8 = Decoder::DecodeFrame
                             (in_stack_fffffffffffffe40,(uint8_t *)in_stack_fffffffffffffe38,
                              0x3d8983);
        in_stack_fffffffffffffe70 = &local_f8;
        testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
                  (in_stack_fffffffffffffe58,
                   (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                   &in_stack_fffffffffffffe48->fmt,(aom_codec_err_t *)in_stack_fffffffffffffe40);
        bVar2 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffe70);
        if (!bVar2) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe70);
          in_stack_fffffffffffffe68 =
               Decoder::DecodeError
                         ((Decoder *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
          in_stack_fffffffffffffe60 =
               testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffe40,(char **)in_stack_fffffffffffffe38);
          in_stack_fffffffffffffe58 =
               testing::AssertionResult::failure_message((AssertionResult *)0x3d8a56);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe70,
                     (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                     (char *)in_stack_fffffffffffffe60,
                     (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
          testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)in_RDI);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe40);
          testing::Message::~Message((Message *)0x3d8ab0);
        }
        local_74 = (uint)!bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d8b1b);
        if (local_74 != 0) {
          return;
        }
        local_75 = 1;
      }
      else {
        if ((local_76 & 1) == 0) {
          (**(code **)(*local_10 + 0x28))();
          (**(code **)(*local_10 + 0x30))();
          local_94 = Decoder::PeekStream((Decoder *)
                                         CONCAT17(in_stack_fffffffffffffe57,
                                                  in_stack_fffffffffffffe50),
                                         (uint8_t *)in_stack_fffffffffffffe48,
                                         (size_t)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
                                        );
          (**(code **)((long)*(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                               *)in_RDI + 0x38))(in_RDI,local_20,local_10,local_94);
          bVar2 = testing::Test::HasFailure();
          local_a9 = !bVar2;
          this_00 = &local_a8;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)in_stack_fffffffffffffe40,(bool *)in_stack_fffffffffffffe38,
                     (type *)0x3d8746);
          bVar2 = testing::AssertionResult::operator_cast_to_bool(this_00);
          if (!bVar2) {
            uVar6 = bVar2;
            testing::Message::Message((Message *)in_stack_fffffffffffffe70);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (in_RDI,in_stack_fffffffffffffeb0,
                       (char *)CONCAT17(bVar7,CONCAT16(uVar6,in_stack_fffffffffffffea8)),
                       &this_00->success_);
            std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe70,
                       (Type)((ulong)in_stack_fffffffffffffe68 >> 0x20),
                       (char *)in_stack_fffffffffffffe60,
                       (int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                       (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
            testing::internal::AssertHelper::operator=((AssertHelper *)this_01,(Message *)in_RDI);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffe40);
            std::__cxx11::string::~string(local_e0);
            testing::Message::~Message((Message *)0x3d8839);
          }
          local_74 = (uint)!bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x3d88c7);
          if (local_74 != 0) {
            return;
          }
          local_76 = 1;
        }
        (**(code **)(*local_10 + 0x28))();
        (**(code **)(*local_10 + 0x30))();
        local_e4 = Decoder::DecodeFrame
                             (in_stack_fffffffffffffe40,(uint8_t *)in_stack_fffffffffffffe38,
                              0x3d8935);
        uVar5 = (**(code **)((long)*(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                     *)in_RDI + 0x28))(in_RDI,local_e4,local_10,local_20);
        if ((uVar5 & 1) == 0) break;
      }
      Decoder::GetDxData((Decoder *)0x3d8b56);
      local_130 = (aom_image_t *)0x0;
      while( true ) {
        bVar2 = testing::Test::HasFailure();
        in_stack_fffffffffffffe57 = false;
        if (!bVar2) {
          local_130 = DxDataIterator::Next((DxDataIterator *)0x3d8b91);
          in_stack_fffffffffffffe57 = local_130 != (aom_image_t *)0x0;
        }
        if ((bool)in_stack_fffffffffffffe57 == false) break;
        in_stack_fffffffffffffe48 = local_130;
        uVar3 = (**(code **)(*local_10 + 0x38))();
        (**(code **)((long)*(unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_RDI + 0x30))(in_RDI,in_stack_fffffffffffffe48,uVar3);
      }
      (**(code **)(*local_10 + 0x20))();
    }
    if (local_20 != (long *)0x0) {
      (**(code **)(*local_20 + 8))();
    }
  }
  return;
}

Assistant:

void DecoderTest::RunLoop(CompressedVideoSource *video,
                          const aom_codec_dec_cfg_t &dec_cfg) {
  Decoder *const decoder = codec_->CreateDecoder(dec_cfg, flags_);
  ASSERT_NE(decoder, nullptr);
  bool end_of_file = false;
  bool peeked_stream = false;

  // Decode frames.
  for (video->Begin(); !::testing::Test::HasFailure() && !end_of_file;
       video->Next()) {
    PreDecodeFrameHook(*video, decoder);

    aom_codec_stream_info_t stream_info;
    stream_info.is_annexb = 0;

    if (video->cxdata() != nullptr) {
      if (!peeked_stream) {
        // TODO(yaowu): PeekStream returns error for non-sequence_header_obu,
        // therefore should only be tried once per sequence, this shall be fixed
        // once PeekStream is updated to properly operate on other obus.
        const aom_codec_err_t res_peek = decoder->PeekStream(
            video->cxdata(), video->frame_size(), &stream_info);
        HandlePeekResult(decoder, video, res_peek);
        ASSERT_FALSE(::testing::Test::HasFailure());
        peeked_stream = true;
      }

      aom_codec_err_t res_dec =
          decoder->DecodeFrame(video->cxdata(), video->frame_size());
      if (!HandleDecodeResult(res_dec, *video, decoder)) break;
    } else {
      // Signal end of the file to the decoder.
      const aom_codec_err_t res_dec = decoder->DecodeFrame(nullptr, 0);
      ASSERT_EQ(AOM_CODEC_OK, res_dec) << decoder->DecodeError();
      end_of_file = true;
    }

    DxDataIterator dec_iter = decoder->GetDxData();
    const aom_image_t *img = nullptr;

    // Get decompressed data
    while (!::testing::Test::HasFailure() && (img = dec_iter.Next()))
      DecompressedFrameHook(*img, video->frame_number());
  }
  delete decoder;
}